

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
     verifyInteger<8u,8u,8u,8u,int>(GLint original_value,GLint positive_value,GLint negated_value)

{
  int iVar1;
  int iVar2;
  Integer<int,_8U,_24U> local_38;
  Integer<int,_8U,_24U> local_34;
  Integer<int,_8U,_24U> negated_alpha;
  Integer<int,_8U,_24U> positive_alpha;
  Integer<int,_8U,_16U> negated_blue;
  Integer<int,_8U,_16U> positive_blue;
  Integer<int,_8U,_8U> negated_green;
  Integer<int,_8U,_8U> positive_green;
  Integer<int,_8U,_0U> negated_red;
  Integer<int,_8U,_0U> positive_red;
  GLint negated_value_local;
  GLint positive_value_local;
  GLint original_value_local;
  
  if (original_value == positive_value) {
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_0U>::Integer
              ((Integer<int,_8U,_0U> *)&positive_green,positive_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_0U>::Integer
              ((Integer<int,_8U,_0U> *)&negated_green,negated_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_8U>::Integer
              ((Integer<int,_8U,_8U> *)&positive_blue,positive_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_8U>::Integer
              ((Integer<int,_8U,_8U> *)&negated_blue,negated_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_16U>::Integer
              ((Integer<int,_8U,_16U> *)&positive_alpha,positive_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_16U>::Integer
              ((Integer<int,_8U,_16U> *)&negated_alpha,negated_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_24U>::Integer
              (&local_34,positive_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_24U>::Integer
              (&local_38,negated_value);
    iVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_0U>::
            GetNegated((Integer<int,_8U,_0U> *)&positive_green);
    iVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_0U>::Get
                      ((Integer<int,_8U,_0U> *)&negated_green);
    if (iVar1 == iVar2) {
      iVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_16U>::
              GetNegated((Integer<int,_8U,_16U> *)&positive_alpha);
      iVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_16U>::Get
                        ((Integer<int,_8U,_16U> *)&negated_alpha);
      if (iVar1 == iVar2) {
        iVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_8U>::
                GetNegated((Integer<int,_8U,_8U> *)&positive_blue);
        iVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_8U>::
                Get((Integer<int,_8U,_8U> *)&negated_blue);
        if (iVar1 == iVar2) {
          iVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_24U>
                  ::GetNegated(&local_34);
          iVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_24U>
                  ::Get(&local_38);
          if (iVar1 == iVar2) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool verifyInteger(GLint original_value, GLint positive_value, GLint negated_value)
	{
		if (original_value != positive_value)
		{
			return false;
		}

		Integer<T, R, 0> positive_red(positive_value);
		Integer<T, R, 0> negated_red(negated_value);

		Integer<T, G, R> positive_green(positive_value);
		Integer<T, G, R> negated_green(negated_value);

		Integer<T, B, R + G> positive_blue(positive_value);
		Integer<T, B, R + G> negated_blue(negated_value);

		Integer<T, A, R + G + B> positive_alpha(positive_value);
		Integer<T, A, R + G + B> negated_alpha(negated_value);

		if (((0 != R) && (positive_red.GetNegated() != negated_red.Get())) ||
			((0 != B) && (positive_blue.GetNegated() != negated_blue.Get())) ||
			((0 != G) && (positive_green.GetNegated() != negated_green.Get())) ||
			((0 != A) && (positive_alpha.GetNegated() != negated_alpha.Get())))
		{
			return false;
		}

		return true;
	}